

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void nullcPrintPointerMarkerInfo(markerType marker)

{
  char *pcVar1;
  ExternTypeInfo *pEVar2;
  char *__format;
  uint codeTypeCount;
  uint local_1c;
  
  pcVar1 = nullcDebugSymbols((uint *)0x0);
  local_1c = 0;
  pEVar2 = nullcDebugTypeInfo(&local_1c);
  __format = "visible";
  if ((marker & 1) == 0) {
    __format = "unmarked";
  }
  printf(__format);
  if ((marker & 2) == 0) {
    if ((marker & 4) != 0) {
      printf(" finalizable");
    }
    if ((marker & 8) != 0) {
      printf(" finalized");
    }
    if ((marker & 0x10) != 0) {
      printf(" array");
    }
    printf(" type \'%s\' #%u",pcVar1 + pEVar2[marker >> 8 & 0xffffffff].offsetToName,
           marker >> 8 & 0xffffffff);
  }
  else {
    printf(" freed");
  }
  return;
}

Assistant:

void nullcPrintPointerMarkerInfo(markerType marker)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	if(marker & OBJECT_VISIBLE)
		printf("visible");
	else
		printf("unmarked");

	if(marker & OBJECT_FREED)
	{
		printf(" freed");
		return;
	}

	if(marker & OBJECT_FINALIZABLE)
		printf(" finalizable");
	if(marker & OBJECT_FINALIZED)
		printf(" finalized");
	if(marker & OBJECT_ARRAY)
		printf(" array");

	unsigned type = unsigned(marker >> 8);

	printf(" type '%s' #%u", codeSymbols + codeTypes[type].offsetToName, type);
}